

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::SanitizerPoisonMemoryRegion(void *m,size_t s)

{
  size_t s_local;
  void *m_local;
  
  return;
}

Assistant:

inline void SanitizerPoisonMemoryRegion(const void* m, size_t s)
		{
#ifdef ADDRESS_SANITIZER
			ASAN_POISON_MEMORY_REGION(m, s);
#endif
#ifdef MEMORY_SANITIZER
			__msan_poison(m, s);
#endif
			(void)m;
			(void)s;
		}